

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,size_t len)

{
  const_reference pvVar1;
  uchar *local_1b0;
  unsigned_long i;
  stringstream ss;
  ostream local_198 [376];
  uchar *local_20;
  size_t len_local;
  uchar *bytes_local;
  
  local_20 = bytes;
  len_local = (size_t)this;
  bytes_local = (uchar *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  for (local_1b0 = (uchar *)0x0; local_1b0 < local_20; local_1b0 = local_1b0 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)HEX_CHARS,
                        (ulong)(local_1b0[len_local] >> 4));
    std::operator<<(local_198,*pvVar1);
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)HEX_CHARS,
                        (ulong)(local_1b0[len_local] & 0xf));
    std::operator<<(local_198,*pvVar1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, size_t len)
{
    std::stringstream ss;

    for (unsigned long i = 0u; i < len; i++)
    {
        ss << HexEncoder::HEX_CHARS[((unsigned int) bytes[i] >> 4u & 0xfu)];
        ss << HexEncoder::HEX_CHARS[(unsigned int) bytes[i] & 0xfu];
    }

    return ss.str();
}